

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

XmlWriter * __thiscall Catch::XmlWriter::startElement(XmlWriter *this,string *name)

{
  ostream *poVar1;
  char local_19;
  
  ensureTagClosed(this);
  newlineIfNecessary(this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->m_os,(this->m_indent)._M_dataplus._M_p,(this->m_indent)._M_string_length
                     );
  local_19 = '<';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_19,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_tags,name);
  std::__cxx11::string::append((char *)&this->m_indent);
  this->m_tagIsOpen = true;
  return this;
}

Assistant:

XmlWriter& startElement( std::string const& name ) {
            ensureTagClosed();
            newlineIfNecessary();
            m_os << m_indent << '<' << name;
            m_tags.push_back( name );
            m_indent += "  ";
            m_tagIsOpen = true;
            return *this;
        }